

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O2

Instr * __thiscall LowererMD::Simd128LowerInt32x4FromFloat32x4(LowererMD *this,Instr *instr)

{
  Opnd *this_00;
  Opnd *this_01;
  Instr *this_02;
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  LabelInstr *branchTarget;
  RegOpnd *dstOpnd;
  RegOpnd *dstOpnd_00;
  RegOpnd *dstOpnd_01;
  RegOpnd *dstOpnd_02;
  intptr_t iVar5;
  MemRefOpnd *pMVar6;
  Instr *pIVar7;
  IntConstOpnd *pIVar8;
  BranchInstr *pBVar9;
  JITTimeFunctionBody *this_03;
  
  this_00 = instr->m_dst;
  this_01 = instr->m_src1;
  if (this_01 != (Opnd *)0x0 && this_00 != (Opnd *)0x0) {
    bVar3 = IR::Opnd::IsSimd128(this_00);
    if (bVar3) {
      bVar3 = IR::Opnd::IsSimd128(this_01);
      if (bVar3) goto LAB_005ee8f3;
    }
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar4 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                     ,0x8f7,
                     "(dst != nullptr && src != nullptr && dst->IsSimd128() && src->IsSimd128())",
                     "dst != nullptr && src != nullptr && dst->IsSimd128() && src->IsSimd128()");
  if (!bVar3) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar4 = 0;
LAB_005ee8f3:
  instr->m_opcode = CVTTPS2DQ;
  this_02 = instr->m_next;
  pIVar1 = instr->m_prev;
  branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
  dstOpnd = IR::RegOpnd::New(TyInt32,this->m_func);
  dstOpnd_00 = IR::RegOpnd::New(TyInt32,this->m_func);
  dstOpnd_01 = IR::RegOpnd::New(TySimd128I4,this->m_func);
  dstOpnd_02 = IR::RegOpnd::New(TySimd128I4,this->m_func);
  iVar5 = ThreadContextInfo::GetX86NegMaskF4Addr(this->m_func->m_threadContextInfo);
  pMVar6 = IR::MemRefOpnd::New(iVar5,TySimd128I4,this->m_func,AddrOpndKindDynamicMisc);
  pIVar7 = IR::Instr::New(MOVAPS,&dstOpnd_02->super_Opnd,&pMVar6->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(this_02,pIVar7);
  Legalize<false>(pIVar7,false);
  pIVar7 = IR::Instr::New(PCMPEQD,&dstOpnd_01->super_Opnd,this_00,&dstOpnd_02->super_Opnd,
                          this->m_func);
  IR::Instr::InsertBefore(this_02,pIVar7);
  Legalize<false>(pIVar7,false);
  pIVar7 = IR::Instr::New(MOVMSKPS,&dstOpnd->super_Opnd,&dstOpnd_01->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(this_02,pIVar7);
  pIVar7 = IR::Instr::New(CMP,this->m_func);
  IR::Instr::SetSrc1(pIVar7,&dstOpnd->super_Opnd);
  pIVar8 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
  IR::Instr::SetSrc2(pIVar7,&pIVar8->super_Opnd);
  IR::Instr::InsertBefore(this_02,pIVar7);
  pBVar9 = IR::BranchInstr::New(JEQ,branchTarget,this->m_func);
  IR::Instr::InsertBefore(this_02,&pBVar9->super_Instr);
  iVar5 = ThreadContextInfo::GetX86TwoPower31F4Addr(this->m_func->m_threadContextInfo);
  pMVar6 = IR::MemRefOpnd::New(iVar5,TySimd128I4,this->m_func,AddrOpndKindDynamicMisc);
  pIVar7 = IR::Instr::New(MOVAPS,&dstOpnd_02->super_Opnd,&pMVar6->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(this_02,pIVar7);
  Legalize<false>(pIVar7,false);
  pIVar7 = IR::Instr::New(CMPLEPS,&dstOpnd_01->super_Opnd,&dstOpnd_02->super_Opnd,this_01,
                          this->m_func);
  IR::Instr::InsertBefore(this_02,pIVar7);
  Legalize<false>(pIVar7,false);
  pIVar7 = IR::Instr::New(MOVMSKPS,&dstOpnd->super_Opnd,&dstOpnd_01->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(this_02,pIVar7);
  iVar5 = ThreadContextInfo::GetX86NegTwoPower31F4Addr(this->m_func->m_threadContextInfo);
  pMVar6 = IR::MemRefOpnd::New(iVar5,TySimd128I4,this->m_func,AddrOpndKindDynamicMisc);
  pIVar7 = IR::Instr::New(MOVAPS,&dstOpnd_02->super_Opnd,&pMVar6->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(this_02,pIVar7);
  Legalize<false>(pIVar7,false);
  pIVar7 = IR::Instr::New(CMPLTPS,&dstOpnd_01->super_Opnd,this_01,&dstOpnd_02->super_Opnd,
                          this->m_func);
  IR::Instr::InsertBefore(this_02,pIVar7);
  Legalize<false>(pIVar7,false);
  pIVar7 = IR::Instr::New(MOVMSKPS,&dstOpnd_00->super_Opnd,&dstOpnd_01->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(this_02,pIVar7);
  pIVar7 = IR::Instr::New(OR,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,&dstOpnd_00->super_Opnd,
                          this->m_func);
  IR::Instr::InsertBefore(this_02,pIVar7);
  this_03 = Func::GetJITFunctionBody(this->m_func);
  bVar3 = JITTimeFunctionBody::IsWasmFunction(this_03);
  if (bVar3) {
    pIVar7 = IR::Instr::New(CMPEQPS,&dstOpnd_01->super_Opnd,this_01,this_01,this->m_func);
    IR::Instr::InsertBefore(this_02,pIVar7);
    Legalize<false>(pIVar7,false);
    pIVar7 = IR::Instr::New(MOVMSKPS,&dstOpnd_00->super_Opnd,&dstOpnd_01->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(this_02,pIVar7);
    pIVar7 = IR::Instr::New(NOT,&dstOpnd_00->super_Opnd,&dstOpnd_00->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(this_02,pIVar7);
    pIVar8 = IR::IntConstOpnd::New(0xf,TyInt32,this->m_func,false);
    pIVar7 = IR::Instr::New(AND,&dstOpnd_00->super_Opnd,&dstOpnd_00->super_Opnd,&pIVar8->super_Opnd,
                            this->m_func);
    IR::Instr::InsertBefore(this_02,pIVar7);
    Legalize<false>(pIVar7,false);
    pIVar7 = IR::Instr::New(OR,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,&dstOpnd_00->super_Opnd,
                            this->m_func);
    IR::Instr::InsertBefore(this_02,pIVar7);
  }
  pIVar7 = IR::Instr::New(CMP,this->m_func);
  IR::Instr::SetSrc1(pIVar7,&dstOpnd->super_Opnd);
  pIVar8 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
  IR::Instr::SetSrc2(pIVar7,&pIVar8->super_Opnd);
  IR::Instr::InsertBefore(this_02,pIVar7);
  pBVar9 = IR::BranchInstr::New(JEQ,branchTarget,this->m_func);
  IR::Instr::InsertBefore(this_02,&pBVar9->super_Instr);
  Lowerer::GenerateRuntimeError(this->m_lowerer,this_02,-0x7ff5ebf6,HelperOp_RuntimeRangeError);
  IR::Instr::InsertBefore(this_02,&branchTarget->super_Instr);
  return pIVar1;
}

Assistant:

IR::Instr* LowererMD::Simd128LowerInt32x4FromFloat32x4(IR::Instr *instr)
{
    IR::Opnd *dst, *src, *tmp, *tmp2, *mask1, *mask2;
    IR::Instr *insertInstr, *pInstr, *newInstr;
    IR::LabelInstr *doneLabel;
    dst = instr->GetDst();
    src = instr->GetSrc1();
    Assert(dst != nullptr && src != nullptr && dst->IsSimd128() && src->IsSimd128());

    // CVTTPS2DQ dst, src
    instr->m_opcode = Js::OpCode::CVTTPS2DQ;
    insertInstr = instr->m_next;
    pInstr = instr->m_prev;
    doneLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    mask1 = IR::RegOpnd::New(TyInt32, m_func);
    mask2 = IR::RegOpnd::New(TyInt32, m_func);

    // bound checks
    // check if any value is potentially out of range (0x80000000 in output)
    // PCMPEQD tmp, dst, X86_NEG_MASK (0x80000000)
    // MOVMSKPS mask1, tmp
    // CMP mask1, 0
    // JNE $doneLabel
    tmp = IR::RegOpnd::New(TySimd128I4, m_func);
    tmp2 = IR::RegOpnd::New(TySimd128I4, m_func);
    newInstr = IR::Instr::New(Js::OpCode::MOVAPS, tmp2, IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86NegMaskF4Addr(), TySimd128I4, m_func), m_func);
    insertInstr->InsertBefore(newInstr);
    Legalize(newInstr);
    newInstr = IR::Instr::New(Js::OpCode::PCMPEQD, tmp, dst, tmp2, m_func);
    insertInstr->InsertBefore(newInstr);
    Legalize(newInstr);
    insertInstr->InsertBefore(IR::Instr::New(Js::OpCode::MOVMSKPS, mask1, tmp, m_func));
    newInstr = IR::Instr::New(Js::OpCode::CMP, m_func);
    newInstr->SetSrc1(mask1);
    newInstr->SetSrc2(IR::IntConstOpnd::New(0, TyInt32, m_func));
    insertInstr->InsertBefore(newInstr);
    insertInstr->InsertBefore(IR::BranchInstr::New(Js::OpCode::JEQ, doneLabel, m_func));

    // we have potential out of bound. check bounds
    // MOVAPS tmp2, X86_TWO_31_F4 (0x4f000000)
    // CMPLEPS tmp, tmp2, src
    // MOVMSKPS mask1, tmp
    // MOVAPS tmp2, X86_NEG_TWO_31_F4 (0xcf000000)
    // CMPLTPS tmp, src, tmp2
    // MOVMSKPS mask2, tmp
    // OR mask1, mask1, mask2
    // check for NaNs
    // CMPEQPS tmp, src
    // MOVMSKPS mask2, tmp
    // NOT mask2
    // AND mask2, 0x00000F
    // OR mask1, mask2
    //
    // CMP mask1, 0
    // JEQ $doneLabel
    newInstr = IR::Instr::New(Js::OpCode::MOVAPS, tmp2, IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86TwoPower31F4Addr(), TySimd128I4, m_func), m_func);
    insertInstr->InsertBefore(newInstr);
    Legalize(newInstr);
    newInstr = IR::Instr::New(Js::OpCode::CMPLEPS, tmp, tmp2, src, m_func);
    insertInstr->InsertBefore(newInstr);
    Legalize(newInstr);
    insertInstr->InsertBefore(IR::Instr::New(Js::OpCode::MOVMSKPS, mask1, tmp, m_func));

    newInstr = IR::Instr::New(Js::OpCode::MOVAPS, tmp2, IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86NegTwoPower31F4Addr(), TySimd128I4, m_func), m_func);
    insertInstr->InsertBefore(newInstr);
    Legalize(newInstr);
    newInstr = IR::Instr::New(Js::OpCode::CMPLTPS, tmp, src, tmp2, m_func);
    insertInstr->InsertBefore(newInstr);
    Legalize(newInstr);

    insertInstr->InsertBefore(IR::Instr::New(Js::OpCode::MOVMSKPS, mask2, tmp, m_func));

    insertInstr->InsertBefore(IR::Instr::New(Js::OpCode::OR, mask1, mask1, mask2, m_func));

#ifdef ENABLE_WASM_SIMD
    if (m_func->GetJITFunctionBody()->IsWasmFunction())
    {
        newInstr = IR::Instr::New(Js::OpCode::CMPEQPS, tmp, src, src, m_func);
        insertInstr->InsertBefore(newInstr);
        Legalize(newInstr);
        insertInstr->InsertBefore(IR::Instr::New(Js::OpCode::MOVMSKPS, mask2, tmp, m_func));
        insertInstr->InsertBefore(IR::Instr::New(Js::OpCode::NOT, mask2, mask2, m_func));
        newInstr = IR::Instr::New(Js::OpCode::AND, mask2, mask2, IR::IntConstOpnd::New(0x00000F, TyInt32, m_func), m_func);
        insertInstr->InsertBefore(newInstr);
        Legalize(newInstr);
        insertInstr->InsertBefore(IR::Instr::New(Js::OpCode::OR, mask1, mask1, mask2, m_func));
    }
#endif

    newInstr = IR::Instr::New(Js::OpCode::CMP, m_func);
    newInstr->SetSrc1(mask1);
    newInstr->SetSrc2(IR::IntConstOpnd::New(0, TyInt32, m_func));
    insertInstr->InsertBefore(newInstr);
    insertInstr->InsertBefore(IR::BranchInstr::New(Js::OpCode::JEQ, doneLabel, m_func));

    // throw range error
    m_lowerer->GenerateRuntimeError(insertInstr, JSERR_ArgumentOutOfRange, IR::HelperOp_RuntimeRangeError);

    insertInstr->InsertBefore(doneLabel);

    return pInstr;
}